

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.h
# Opt level: O1

void __thiscall OutputContext::Print(OutputContext *this,char *format,__va_list_tag *args)

{
  byte *pbVar1;
  char cVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  undefined8 *puVar6;
  uint *puVar7;
  size_t sVar8;
  byte *pbVar9;
  uint uVar10;
  ulong uVar11;
  byte *pbVar12;
  ulong uVar13;
  byte *__s;
  uint uVar14;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  char reverse [16];
  char forward [16];
  byte local_68;
  byte local_67 [15];
  __va_list_tag *local_58;
  ulong local_50;
  byte local_48 [24];
  
  local_50 = (ulong)(1 - (int)&local_68);
  do {
    for (lVar15 = 0; (format[lVar15] != '\0' && (format[lVar15] != '%')); lVar15 = lVar15 + 1) {
    }
    if (lVar15 != 0) {
      Print(this,format,(uint)lVar15);
    }
    pcVar16 = format + lVar15;
    cVar2 = *pcVar16;
    if (cVar2 == '%') {
      if (format[lVar15 + 1] == 's') {
        uVar14 = args->gp_offset;
        if ((ulong)uVar14 < 0x29) {
          puVar6 = (undefined8 *)((ulong)uVar14 + (long)args->reg_save_area);
          args->gp_offset = uVar14 + 8;
        }
        else {
          puVar6 = (undefined8 *)args->overflow_arg_area;
          args->overflow_arg_area = puVar6 + 1;
        }
        pcVar16 = format + lVar15 + 2;
        __s = (byte *)*puVar6;
        sVar8 = strlen((char *)__s);
        uVar14 = (uint)sVar8;
      }
      else {
        if (((format[lVar15 + 1] != '.') || (format[lVar15 + 2] != '*')) ||
           (format[lVar15 + 3] != 's')) {
          if (format[lVar15 + 1] != '%') goto LAB_00112434;
          pcVar16 = format + lVar15 + 2;
          uVar14 = this->outputBufPos;
          this->outputBufPos = uVar14 + 1;
          this->outputBuf[uVar14] = '%';
          iVar5 = 0;
          if (this->outputBufPos == this->outputBufSize) {
            (*this->writeStream)(this->stream,this->outputBuf,this->outputBufPos);
            this->outputBufPos = 0;
          }
          goto LAB_00112635;
        }
        uVar14 = args->gp_offset;
        if ((ulong)uVar14 < 0x29) {
          puVar7 = (uint *)((ulong)uVar14 + (long)args->reg_save_area);
          args->gp_offset = uVar14 + 8;
        }
        else {
          puVar7 = (uint *)args->overflow_arg_area;
          args->overflow_arg_area = puVar7 + 2;
        }
        uVar14 = *puVar7;
        uVar10 = args->gp_offset;
        if ((ulong)uVar10 < 0x29) {
          puVar6 = (undefined8 *)((ulong)uVar10 + (long)args->reg_save_area);
          args->gp_offset = uVar10 + 8;
        }
        else {
          puVar6 = (undefined8 *)args->overflow_arg_area;
          args->overflow_arg_area = puVar6 + 1;
        }
        pcVar16 = format + lVar15 + 4;
        __s = (byte *)*puVar6;
      }
LAB_0011262d:
      Print(this,(char *)__s,uVar14);
      iVar5 = 0;
    }
    else {
LAB_00112434:
      if (cVar2 == '%') {
        cVar2 = format[lVar15 + 1];
        pcVar17 = format + lVar15 + 2;
        if (cVar2 != '0') {
          pcVar17 = format + lVar15 + 1;
        }
        uVar14 = (int)*pcVar17 - 0x30;
        pcVar17 = pcVar17 + (uVar14 < 10);
        if ((*pcVar17 != 'd') && (*pcVar17 != 'x')) goto LAB_00112492;
        uVar10 = args->gp_offset;
        if ((ulong)uVar10 < 0x29) {
          puVar7 = (uint *)((ulong)uVar10 + (long)args->reg_save_area);
          args->gp_offset = uVar10 + 8;
        }
        else {
          puVar7 = (uint *)args->overflow_arg_area;
          args->overflow_arg_area = puVar7 + 2;
        }
        uVar10 = *puVar7;
        if ((*pcVar17 == 'd') && ((int)uVar10 < 0)) {
          uVar3 = this->outputBufPos;
          this->outputBufPos = uVar3 + 1;
          this->outputBuf[uVar3] = '-';
          if (this->outputBufPos == this->outputBufSize) {
            local_58 = args;
            (*this->writeStream)(this->stream,this->outputBuf,this->outputBufPos);
            this->outputBufPos = 0;
            args = local_58;
          }
        }
        uVar3 = -uVar10;
        if (0 < (int)uVar10) {
          uVar3 = uVar10;
        }
        if (*pcVar17 != 'd') {
          uVar3 = uVar10;
        }
        uVar11 = (ulong)uVar3;
        if (*pcVar17 == 'd') {
          local_68 = (char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30;
          pbVar9 = local_67;
          if (9 < uVar3) {
            do {
              uVar10 = (uint)uVar11;
              uVar13 = uVar11 / 10;
              uVar11 = uVar11 / 10;
              *pbVar9 = (char)uVar11 + (char)(uVar13 * 0x1999999a >> 0x20) * -10 | 0x30;
              pbVar9 = pbVar9 + 1;
            } while (99 < uVar10);
          }
        }
        else {
          local_68 = "0123456789abcdef"[uVar3 & 0xf];
          pbVar9 = local_67;
          if (0xf < uVar3) {
            do {
              *pbVar9 = "0123456789abcdef"[(uint)(uVar11 >> 4) & 0xf];
              pbVar9 = pbVar9 + 1;
              uVar10 = (uint)uVar11;
              uVar11 = uVar11 >> 4;
            } while (0xff < uVar10);
          }
        }
        __s = local_48;
        if ((uVar14 < 10) && ((uint)((int)pbVar9 - (int)&local_68) < uVar14)) {
          uVar10 = (int)local_50 + (int)pbVar9;
          do {
            *pbVar9 = (cVar2 == '0') << 4 | 0x20;
            pbVar9 = pbVar9 + 1;
            if (9 < uVar14) break;
            bVar4 = uVar10 < uVar14;
            uVar10 = uVar10 + 1;
          } while (bVar4);
        }
        pcVar16 = pcVar17 + 1;
        pbVar12 = __s;
        do {
          pbVar1 = pbVar9 + -1;
          pbVar9 = pbVar9 + -1;
          *pbVar12 = *pbVar1;
          pbVar12 = pbVar12 + 1;
        } while (pbVar9 != &local_68);
        *pbVar12 = 0;
        sVar8 = strlen((char *)__s);
        uVar14 = (uint)sVar8;
        goto LAB_0011262d;
      }
      if (cVar2 == '\0') {
        iVar5 = 1;
      }
      else {
LAB_00112492:
        iVar5 = 2;
      }
    }
LAB_00112635:
    format = pcVar16;
    if (iVar5 != 0) {
      if (iVar5 == 2) {
        iVar5 = vsnprintf(this->tempBuf,(ulong)(this->tempBufSize - 1),pcVar16,args);
        if ((iVar5 < 0) || ((int)this->tempBufSize <= iVar5)) {
          (*this->writeStream)(this->stream,this->outputBuf,this->outputBufPos);
          this->outputBufPos = 0;
          (*this->writeStream)(this->stream,this->tempBuf,this->tempBufSize - 1);
          __assert_fail("!\"temporary buffer is too small\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Output.h"
                        ,0xe4,"void OutputContext::Print(const char *, __va_list_tag *)");
        }
        pcVar16 = this->tempBuf;
        sVar8 = strlen(pcVar16);
        Print(this,pcVar16,(uint)sVar8);
      }
      return;
    }
  } while( true );
}

Assistant:

void Print(const char *format, va_list args)
	{
		const char *pos = format;

		for(;;)
		{
			const char *start = pos;

			while(*pos && *pos != '%')
				pos++;

			if(pos != start)
				Print(start, unsigned(pos - start));

			if(pos[0] == '%' && pos[1] == 's')
			{
				pos += 2;

				char *str = va_arg(args, char*);

				Print(str);
			}
			else if(pos[0] == '%' && pos[1] == '.' && pos[2] == '*' && pos[3] == 's')
			{
				pos += 4;

				unsigned length = va_arg(args, unsigned);
				char *str = va_arg(args, char*);

				Print(str, length);
			}
			else if(pos[0] == '%' && pos[1] == '%')
			{
				pos += 2;

				Print('%');
			}
			else if(pos[0] == '%')
			{
				const char *tmpPos = pos + 1;

				bool leadingZeroes = false;

				if(*tmpPos == '0')
				{
					leadingZeroes = true;

					tmpPos++;
				}

				unsigned width = 0;

				if(unsigned(*tmpPos - '0') < 10)
				{
					width = unsigned(*tmpPos - '0');

					tmpPos++;
				}

				if(*tmpPos == 'd' || *tmpPos == 'x')
				{
					pos = tmpPos + 1;

					int value = va_arg(args, int);

					if(*tmpPos == 'd' && value < 0)
						Print('-');

					unsigned uvalue;

					if(*tmpPos == 'd' && value < 0)
						uvalue = -value;
					else
						uvalue = value;

					char reverse[16];

					char *curr = reverse;

					if(*tmpPos == 'd')
					{
						*curr++ = (char)((uvalue % 10) + '0');

						while(uvalue /= 10)
							*curr++ = (char)((uvalue % 10) + '0');
					}
					else
					{
						const char *symbols = "0123456789abcdef";

						*curr++ = symbols[uvalue % 16];

						while(uvalue /= 16)
							*curr++ = symbols[uvalue % 16];
					}

					while(unsigned(curr - reverse) < width)
						*curr++ = leadingZeroes ? '0' : ' ';

					char forward[16];

					char *result = forward;

					do
					{
						--curr;
						*result++ = *curr;
					}
					while(curr != reverse);

					*result = 0;

					Print(forward);
				}
				else
				{
					break;
				}
			}
			else if(pos[0] == 0)
			{
				return;
			}
			else
			{
				break;
			}
		}

		int length = vsnprintf(tempBuf, tempBufSize - 1, pos, args);

		if(length < 0 || length > int(tempBufSize) - 1)
		{
			writeStream(stream, outputBuf, outputBufPos);
			outputBufPos = 0;

			writeStream(stream, tempBuf, tempBufSize - 1);

			assert(!"temporary buffer is too small");
		}
		else
		{
			Print(tempBuf);
		}
	}